

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::OPAtomIndexFooter::PushIndexEntry(OPAtomIndexFooter *this,IndexEntry *Entry)

{
  pointer *ppIVar1;
  iterator __position;
  i8_t iVar2;
  ui8_t uVar3;
  undefined5 uVar4;
  ILogSink *this_00;
  IndexTableSegment *pIVar5;
  ui64_t uVar6;
  ulong uVar7;
  
  if (this->m_BytesPerEditUnit != 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Call to PushIndexEntry() failed: index is CBR\n");
    return;
  }
  pIVar5 = this->m_CurrentSegment;
  if (pIVar5 == (IndexTableSegment *)0x0) {
    pIVar5 = (IndexTableSegment *)operator_new(0x120);
    IndexTableSegment::IndexTableSegment(pIVar5,(this->super_Partition).m_Dict);
    uVar6 = 0;
  }
  else {
    uVar7 = ((long)(pIVar5->IndexEntryArray).
                   super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                   .
                   super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                   .
                   super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pIVar5->IndexEntryArray).
                   super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                   .
                   super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                   .
                   super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    if (uVar7 < 5000) goto LAB_001a9b59;
    pIVar5->IndexDuration = uVar7;
    uVar6 = pIVar5->IndexStartPosition;
    pIVar5 = (IndexTableSegment *)operator_new(0x120);
    IndexTableSegment::IndexTableSegment(pIVar5,(this->super_Partition).m_Dict);
    uVar6 = uVar6 + uVar7;
  }
  this->m_CurrentSegment = pIVar5;
  (*(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0xd])(this,pIVar5);
  std::
  vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
  ::push_back(&(this->m_CurrentSegment->DeltaEntryArray).
               super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
               .
               super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
              ,&this->m_DefaultDeltaEntry);
  pIVar5 = this->m_CurrentSegment;
  (pIVar5->IndexEditRate).super_Rational.Numerator = (this->m_EditRate).super_Rational.Numerator;
  (pIVar5->IndexEditRate).super_Rational.Denominator = (this->m_EditRate).super_Rational.Denominator
  ;
  pIVar5->IndexStartPosition = uVar6;
LAB_001a9b59:
  pIVar5 = this->m_CurrentSegment;
  __position._M_current =
       (pIVar5->IndexEntryArray).
       super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
       .
       super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
       .
       super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (pIVar5->IndexEntryArray).
      super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
      .
      super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
      .
      super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ((__position._M_current)->super_IArchive)._vptr_IArchive = (_func_int **)&PTR__IArchive_00224af0
    ;
    iVar2 = Entry->KeyFrameOffset;
    uVar3 = Entry->Flags;
    uVar4 = *(undefined5 *)&Entry->field_0xb;
    uVar6 = Entry->StreamOffset;
    (__position._M_current)->TemporalOffset = Entry->TemporalOffset;
    (__position._M_current)->KeyFrameOffset = iVar2;
    (__position._M_current)->Flags = uVar3;
    *(undefined5 *)&(__position._M_current)->field_0xb = uVar4;
    (__position._M_current)->StreamOffset = uVar6;
    ppIVar1 = &(pIVar5->IndexEntryArray).
               super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
               .
               super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
               .
               super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
    return;
  }
  std::
  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
  ::_M_realloc_insert<ASDCP::MXF::IndexTableSegment::IndexEntry_const&>
            ((vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
              *)&(pIVar5->IndexEntryArray).
                 super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                 .
                 super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
             ,__position,Entry);
  return;
}

Assistant:

void
ASDCP::MXF::OPAtomIndexFooter::PushIndexEntry(const IndexTableSegment::IndexEntry& Entry)
{
  if ( m_BytesPerEditUnit != 0 )  // are we CBR? that's bad 
    {
      DefaultLogSink().Error("Call to PushIndexEntry() failed: index is CBR\n");
      return;
    }

  // do we have an available segment?
  if ( m_CurrentSegment == 0 )
    { // no, set up a new segment
      m_CurrentSegment = new IndexTableSegment(m_Dict);
      assert(m_CurrentSegment);
      AddChildObject(m_CurrentSegment);
      m_CurrentSegment->DeltaEntryArray.push_back(m_DefaultDeltaEntry);
      m_CurrentSegment->IndexEditRate = m_EditRate;
      m_CurrentSegment->IndexStartPosition = 0;
    }
  else if ( m_CurrentSegment->IndexEntryArray.size() >= CBRIndexEntriesPerSegment )
    { // no, this one is full, start another
      m_CurrentSegment->IndexDuration = m_CurrentSegment->IndexEntryArray.size();
      ui64_t StartPosition = m_CurrentSegment->IndexStartPosition + m_CurrentSegment->IndexDuration;

      m_CurrentSegment = new IndexTableSegment(m_Dict);
      assert(m_CurrentSegment);
      AddChildObject(m_CurrentSegment);
      m_CurrentSegment->DeltaEntryArray.push_back(m_DefaultDeltaEntry);
      m_CurrentSegment->IndexEditRate = m_EditRate;
      m_CurrentSegment->IndexStartPosition = StartPosition;
    }

  m_CurrentSegment->IndexEntryArray.push_back(Entry);
}